

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O2

StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
google::protobuf::util::converter::DataPiece::ToBytes_abi_cxx11_
          (StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,DataPiece *this)

{
  StringPiece default_string;
  undefined1 this_00 [8];
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  string *this_01;
  StringPiece value_str;
  StringPiece value_str_00;
  StringPiece SVar4;
  StringPiece local_a8;
  string local_98;
  StringPiece local_78;
  undefined1 local_68 [8];
  string decoded;
  string local_40;
  
  if (this->type_ == TYPE_STRING) {
    local_68 = (undefined1  [8])&decoded._M_string_length;
    decoded._M_dataplus._M_p = (pointer)0x0;
    decoded._M_string_length._0_1_ = 0;
    SVar4 = protobuf::internal::StringPiecePod::operator_cast_to_StringPiece(&(this->field_2).str_);
    bVar1 = DecodeBase64(this,SVar4,(string *)local_68);
    if (!bVar1) {
      StringPiece::StringPiece(&local_78,"Invalid data in input.");
      SVar4.length_ = local_78.length_;
      SVar4.ptr_ = local_78.ptr_;
      ValueAsStringOrDefault_abi_cxx11_(&local_98,this,SVar4);
      pcVar2 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_98._M_string_length);
      value_str_00.length_ = local_78.length_;
      value_str_00.ptr_ = pcVar2;
      anon_unknown_1::InvalidArgument
                ((Status *)((long)&decoded.field_2 + 8),(anon_unknown_1 *)local_98._M_dataplus._M_p,
                 value_str_00);
      StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      StatusOr(__return_storage_ptr__,(Status *)((long)&decoded.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_40);
      psVar3 = &local_98;
      goto LAB_00324733;
    }
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    StatusOr(__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
  }
  else {
    if (this->type_ == TYPE_BYTES) {
      psVar3 = (string *)((long)&decoded.field_2 + 8);
      protobuf::internal::StringPiecePod::ToString_abi_cxx11_(psVar3,&(this->field_2).str_);
      StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      StatusOr(__return_storage_ptr__,psVar3);
      this_01 = (string *)(decoded.field_2._M_local_buf + 8);
      goto LAB_0032473c;
    }
    StringPiece::StringPiece
              (&local_a8,"Wrong type. Only String or Bytes can be converted to Bytes.");
    default_string.length_ = local_a8.length_;
    default_string.ptr_ = local_a8.ptr_;
    ValueAsStringOrDefault_abi_cxx11_((string *)local_68,this,default_string);
    this_00 = local_68;
    pcVar2 = (char *)StringPiece::CheckedSsizeTFromSizeT((size_t)decoded._M_dataplus._M_p);
    value_str.length_ = local_a8.length_;
    value_str.ptr_ = pcVar2;
    anon_unknown_1::InvalidArgument
              ((Status *)((long)&decoded.field_2 + 8),(anon_unknown_1 *)this_00,value_str);
    StatusOr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    StatusOr(__return_storage_ptr__,(Status *)((long)&decoded.field_2 + 8));
    psVar3 = &local_40;
LAB_00324733:
    std::__cxx11::string::~string((string *)psVar3);
  }
  this_01 = (string *)local_68;
LAB_0032473c:
  std::__cxx11::string::~string(this_01);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<std::string> DataPiece::ToBytes() const {
  if (type_ == TYPE_BYTES) return str_.ToString();
  if (type_ == TYPE_STRING) {
    std::string decoded;
    if (!DecodeBase64(str_, &decoded)) {
      return InvalidArgument(ValueAsStringOrDefault("Invalid data in input."));
    }
    return decoded;
  } else {
    return InvalidArgument(ValueAsStringOrDefault(
        "Wrong type. Only String or Bytes can be converted to Bytes."));
  }
}